

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_abs(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  ggml_tensor *src0_00;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  FILE *__stream;
  char cVar13;
  ggml_bf16_t gVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int64_t ir;
  long lVar20;
  char *pcVar21;
  long lVar22;
  ggml_tensor *src0;
  int64_t ir_2;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  pair<long,_long> pVar27;
  undefined8 uStack_90;
  long local_60;
  
  __stream = _stderr;
  src0_00 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = src0_00->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0_00);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0_00,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_00127820:
          pcVar21 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_00127850;
        }
        if (src0_00->nb[0] == 2) {
          sVar3 = src0_00->nb[1];
          sVar4 = src0_00->nb[2];
          lVar5 = src0_00->ne[1];
          lVar23 = src0_00->ne[2];
          sVar6 = dst->nb[1];
          sVar8 = src0_00->nb[3];
          uVar7 = dst->ne[0];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar27 = get_thread_range(params,src0_00);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar27.first; lVar20 < pVar27.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0_00->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              *(uint *)((long)pvVar11 +
                       uVar17 * 4 + lVar22 * sVar6 + lVar15 * sVar10 + lVar16 * sVar9) =
                   (*(ushort *)
                     ((long)pvVar12 + uVar17 * 2 + lVar22 * sVar3 + lVar15 * sVar8 + lVar16 * sVar4)
                   & 0x7fff) << 0x10;
            }
          }
          return;
        }
LAB_00127839:
        pcVar21 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_00127850;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_001277cf;
      cVar13 = ggml_is_contiguous_1(src0_00);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0_00,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00127820;
        if (src0_00->nb[0] == 2) {
          sVar3 = src0_00->nb[1];
          sVar4 = src0_00->nb[2];
          sVar6 = src0_00->nb[3];
          lVar5 = src0_00->ne[1];
          lVar23 = src0_00->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar27 = get_thread_range(params,src0_00);
          lVar23 = lVar23 * lVar5;
          while( true ) {
            local_60 = pVar27.second;
            lVar20 = pVar27.first;
            if (local_60 <= lVar20) break;
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = src0_00->data;
            pvVar12 = dst->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              gVar14 = f32_to_bf16((float)((*(ushort *)
                                             ((long)pvVar11 +
                                             uVar17 * 2 +
                                             lVar22 * sVar3 + lVar15 * sVar6 + lVar16 * sVar4) &
                                           0x7fff) << 0x10));
              *(uint16_t *)
               ((long)pvVar12 + uVar17 * 2 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) =
                   gVar14.bits;
            }
            pVar27.second = local_60;
            pVar27.first = lVar20 + 1;
          }
          return;
        }
        goto LAB_00127839;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0_00);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0_00,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_00127820;
        if (src0_00->nb[0] == 2) {
          sVar3 = src0_00->nb[2];
          sVar4 = src0_00->nb[3];
          sVar6 = src0_00->nb[1];
          lVar5 = src0_00->ne[1];
          lVar23 = src0_00->ne[2];
          sVar8 = dst->nb[2];
          sVar9 = dst->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[1];
          pVar27 = get_thread_range(params,src0_00);
          auVar26._8_4_ = 0x7fffffff;
          auVar26._0_8_ = 0x7fffffff7fffffff;
          auVar26._12_4_ = 0x7fffffff;
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar27.first; lVar20 < pVar27.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0_00->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar25 = vandps_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)pvVar12 +
                                                            uVar17 * 2 +
                                                            lVar22 * sVar6 + lVar15 * sVar4 +
                                                            lVar16 * sVar3) * 4)),auVar26);
              *(int *)((long)pvVar11 +
                      uVar17 * 4 + lVar22 * sVar10 + lVar15 * sVar9 + lVar16 * sVar8) =
                   auVar25._0_4_;
            }
          }
          return;
        }
        goto LAB_00127839;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_001277cf;
      cVar13 = ggml_is_contiguous_1(src0_00);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0_00,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_00127820;
        if (src0_00->nb[0] == 2) {
          sVar3 = src0_00->nb[2];
          sVar4 = src0_00->nb[3];
          sVar6 = src0_00->nb[1];
          lVar5 = src0_00->ne[1];
          lVar23 = src0_00->ne[2];
          uVar7 = dst->ne[0];
          pVar27 = get_thread_range(params,src0_00);
          auVar25._8_4_ = 0x7fffffff;
          auVar25._0_8_ = 0x7fffffff7fffffff;
          auVar25._12_4_ = 0x7fffffff;
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar27.first; lVar20 < pVar27.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 % lVar23;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar26 = vandps_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                    (ulong)*(ushort *)
                                                            ((long)src0_00->data +
                                                            uVar17 * 2 +
                                                            (lVar15 % lVar5) * sVar6 +
                                                            (lVar20 / lVar23) * sVar4 +
                                                            (lVar15 / lVar5) * sVar3) * 4)),auVar25)
              ;
              auVar26 = vcvtps2ph_f16c(auVar26,0);
              vpextrw_avx(auVar26,0);
            }
          }
          return;
        }
        goto LAB_00127839;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_001277cf:
      uVar18 = ggml_type_name();
      uVar19 = ggml_type_name(src0_00->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar18,uVar19);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar13 = ggml_is_contiguous_1(src0_00);
    if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
       (cVar13 = ggml_are_same_shape(src0_00,dst), cVar13 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_00127820;
      if (src0_00->nb[0] == 4) {
        sVar3 = src0_00->nb[1];
        sVar4 = src0_00->nb[2];
        lVar5 = src0_00->ne[1];
        lVar23 = src0_00->ne[2];
        sVar6 = src0_00->nb[3];
        uVar7 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        pVar27 = get_thread_range(params,src0_00);
        auVar24._8_4_ = 0x7fffffff;
        auVar24._0_8_ = 0x7fffffff7fffffff;
        auVar24._12_4_ = 0x7fffffff;
        lVar23 = lVar23 * lVar5;
        for (lVar20 = pVar27.first; lVar20 < pVar27.second; lVar20 = lVar20 + 1) {
          lVar15 = lVar20 / lVar23;
          lVar22 = lVar20 % lVar23;
          lVar16 = lVar22 / lVar5;
          lVar22 = lVar22 % lVar5;
          pvVar11 = dst->data;
          pvVar12 = src0_00->data;
          for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
            auVar26 = vandps_avx(ZEXT416(*(uint *)((long)pvVar12 +
                                                  uVar17 * 4 +
                                                  lVar22 * sVar3 + lVar15 * sVar6 + lVar16 * sVar4))
                                 ,auVar24);
            *(int *)((long)pvVar11 + uVar17 * 4 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9)
                 = auVar26._0_4_;
          }
        }
        return;
      }
      goto LAB_00127839;
    }
  }
  pcVar21 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_00127850:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar21);
}

Assistant:

void ggml_compute_forward_abs(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_abs>(params, dst);
}